

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

bool QResource::registerResource(QString *rccFilename,QString *resourceRoot)

{
  uchar *puVar1;
  QAtomicInt *pQVar2;
  bool bVar3;
  int iVar4;
  QDynamicBufferResourceRoot *this;
  void *__buf;
  void *pvVar5;
  uchar *b;
  ushort *puVar6;
  ushort *puVar7;
  Type *this_00;
  Type *pTVar8;
  size_t __nbytes;
  int __oflag;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_> *this_01;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QMessageLogger local_98;
  QString local_70;
  QString local_58;
  long local_38;
  
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
             *)&local_98;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_70.d.d = (resourceRoot->d).d;
  local_70.d.ptr = (resourceRoot->d).ptr;
  local_70.d.size = (resourceRoot->d).size;
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qt_resource_fixResourceRoot(&local_58,&local_70);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
LAB_00251f00:
    this = (QDynamicBufferResourceRoot *)operator_new(0x70);
    (this->super_QResourceRoot).payloads = (uchar *)0x0;
    (this->super_QResourceRoot).version = 0;
    (this->super_QResourceRoot).ref = (QAtomicInteger<int>)0x0;
    (this->super_QResourceRoot).tree = (uchar *)0x0;
    (this->super_QResourceRoot).names = (uchar *)0x0;
    (this->super_QResourceRoot)._vptr_QResourceRoot =
         (_func_int **)&PTR__QDynamicBufferResourceRoot_00697668;
    (this->root).d.d = local_58.d.d;
    (this->root).d.ptr = local_58.d.ptr;
    (this->root).d.size = local_58.d.size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this->buffer = (uchar *)0x0;
    (this->super_QResourceRoot)._vptr_QResourceRoot =
         (_func_int **)&PTR__QDynamicFileResourceRoot_00697608;
    this[1].super_QResourceRoot._vptr_QResourceRoot = (_func_int **)0x0;
    this[1].super_QResourceRoot.tree = (uchar *)0x0;
    this[1].super_QResourceRoot.names = (uchar *)0x0;
    this[1].super_QResourceRoot.payloads = (uchar *)0x0;
    this[1].super_QResourceRoot.version = 0;
    this[1].super_QResourceRoot.ref = (QAtomicInteger<int>)0x0;
    local_98.context.version = -0x55555556;
    local_98.context.line = -0x55555556;
    local_98.context.file._0_4_ = 0xaaaaaaaa;
    local_98.context.file._4_4_ = 0xaaaaaaaa;
    QFile::QFile((QFile *)&local_98,rccFilename);
    iVar4 = QFile::open((QFile *)&local_98,(char *)0x1,__oflag);
    if ((char)iVar4 != '\0') {
      __buf = (void *)QFile::size((QFile *)&local_98);
      pvVar5 = __buf;
      if ((long)__buf < 0) {
        pvVar5 = (void *)(**(code **)(CONCAT44(local_98.context.line,local_98.context.version) +
                                     0x80))();
      }
      iVar4 = QFileDevice::handle((QFileDevice *)&local_98);
      __nbytes = 2;
      b = (uchar *)mmap64((void *)0x0,(size_t)pvVar5,1,2,iVar4,0);
      puVar1 = b + 1;
      if (puVar1 < (uchar *)0x2) {
        b = (uchar *)operator_new__((ulong)__buf);
        pvVar5 = (void *)QIODevice::read((QIODevice *)&local_98,(int)b,__buf,__nbytes);
        if (__buf != pvVar5) {
          operator_delete__(b);
          goto LAB_002520d8;
        }
      }
      bVar3 = anon_unknown.dwarf_44defc::QDynamicBufferResourceRoot::registerSelf
                        (this,b,(qsizetype)__buf);
      if (bVar3) {
        if ((uchar *)0x1 < puVar1) {
          this[1].super_QResourceRoot.payloads = b;
          *(void **)&this[1].super_QResourceRoot.version = __buf;
        }
        QString::operator=((QString *)(this + 1),rccFilename);
        QFile::~QFile((QFile *)&local_98);
        LOCK();
        pQVar2 = &(this->super_QResourceRoot).ref;
        (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                  ::operator->(this_01);
        timeout.t2 = 0;
        timeout.type = 1;
        timeout.t1 = 0x7fffffffffffffff;
        pTVar8 = this_00;
        QRecursiveMutex::tryLock(&this_00->resourceMutex,timeout);
        pTVar8 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                 ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                               *)pTVar8);
        QList<(anonymous_namespace)::QResourceRoot_*>::append
                  (&pTVar8->resourceList,(parameter_type)this);
        QRecursiveMutex::unlock(&this_00->resourceMutex);
        bVar3 = true;
        goto LAB_002520eb;
      }
    }
LAB_002520d8:
    QFile::~QFile((QFile *)&local_98);
    (*(this->super_QResourceRoot)._vptr_QResourceRoot[1])(this);
  }
  else {
    if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(&local_58,local_58.d.size,KeepSize);
    }
    if (*local_58.d.ptr == L'/') goto LAB_00251f00;
    local_98.context.version = 2;
    local_98.context.line = 0;
    local_98.context.file._0_4_ = 0;
    local_98.context.file._4_4_ = 0;
    local_98.context.function._0_4_ = 0;
    local_98.context.function._4_4_ = 0;
    local_98.context.category = "default";
    puVar6 = QString::utf16(rccFilename);
    puVar7 = QString::utf16(resourceRoot);
    QMessageLogger::warning
              (&local_98,
               "QDir::registerResource: Registering a resource [%ls] must be rooted in an absolute path (start with /) [%ls]"
               ,puVar6,puVar7);
  }
  bVar3 = false;
LAB_002520eb:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QResource::registerResource(const QString &rccFilename, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%ls] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 qUtf16Printable(rccFilename), qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicFileResourceRoot *root = new QDynamicFileResourceRoot(r);
    if (root->registerSelf(rccFilename)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}